

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Reader::decodeDouble(Reader *this,Token *token,Value *decoded)

{
  char *pcVar1;
  char *pcVar2;
  byte bVar3;
  long *plVar4;
  Value local_278;
  undefined4 local_250;
  allocator<char> local_249;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  istringstream local_1e8 [8];
  istringstream is;
  allocator<char> local_51;
  string local_50 [8];
  string buffer;
  double value;
  Value *decoded_local;
  Token *token_local;
  Reader *this_local;
  
  buffer.field_2._8_8_ = 0;
  pcVar1 = token->start_;
  pcVar2 = token->end_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>(local_50,pcVar1,pcVar2,&local_51);
  std::allocator<char>::~allocator(&local_51);
  std::__cxx11::istringstream::istringstream(local_1e8,local_50,8);
  plVar4 = (long *)std::istream::operator>>
                             ((istream *)local_1e8,(double *)((long)&buffer.field_2 + 8));
  bVar3 = std::ios::operator!((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
  if ((bVar3 & 1) == 0) {
    Value::Value(&local_278,(double)buffer.field_2._8_8_);
    Value::operator=(decoded,&local_278);
    Value::~Value(&local_278);
    this_local._7_1_ = true;
  }
  else {
    pcVar1 = token->start_;
    pcVar2 = token->end_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>((string *)&local_248,pcVar1,pcVar2,&local_249);
    std::operator+(&local_228,"\'",&local_248);
    std::operator+(&local_208,&local_228,"\' is not a number.");
    this_local._7_1_ = addError(this,&local_208,token,(Location)0x0);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator(&local_249);
  }
  local_250 = 1;
  std::__cxx11::istringstream::~istringstream(local_1e8);
  std::__cxx11::string::~string(local_50);
  return this_local._7_1_;
}

Assistant:

bool Reader::decodeDouble(Token& token, Value& decoded) {
  double value = 0;
  JSONCPP_STRING buffer(token.start_, token.end_);
  JSONCPP_ISTRINGSTREAM is(buffer);
  if (!(is >> value))
    return addError("'" + JSONCPP_STRING(token.start_, token.end_) +
                        "' is not a number.",
                    token);
  decoded = value;
  return true;
}